

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O1

void __thiscall
LLVMBC::LLVMContext::TypedDeleter<LLVMBC::NamedMDNode>::run(TypedDeleter<LLVMBC::NamedMDNode> *this)

{
  NamedMDNode *pNVar1;
  pointer ptr;
  pointer ptr_00;
  
  pNVar1 = this->ptr;
  ptr = (pNVar1->operands).
        super__Vector_base<LLVMBC::MDNode_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::MDNode_*>_>.
        _M_impl.super__Vector_impl_data._M_start;
  if (ptr != (pointer)0x0) {
    ::dxil_spv::free_in_thread(ptr);
  }
  ptr_00 = (pNVar1->name)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>_11
       *)ptr_00 != &(pNVar1->name).field_2) {
    ::dxil_spv::free_in_thread(ptr_00);
    return;
  }
  return;
}

Assistant:

void run() override
		{
			ptr->~T();
		}